

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

void __thiscall ON_ClippingRegionPoints::Destroy(ON_ClippingRegionPoints *this)

{
  double *p;
  ON_ClippingRegionPoints *this_local;
  
  if (((this->m_buffer_point_capacity != 0) && (this->m_buffer != (void *)0x0)) &&
     (this->m_buffer != (void *)0x0)) {
    operator_delete(this->m_buffer,8);
  }
  memset(this,0,0x30);
  return;
}

Assistant:

void ON_ClippingRegionPoints::Destroy()
{
  if (m_buffer_point_capacity > 0 && nullptr != m_buffer)
  {
    double* p = (double*)m_buffer;
    delete p;
  }
  memset(this, 0, sizeof(*this));
}